

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O1

bool __thiscall
picojson::
input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::expect(input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *this,int expected)

{
  uint uVar1;
  int iVar2;
  undefined4 in_register_00000034;
  
  iVar2 = expected;
  do {
    uVar1 = getc(this,(FILE *)CONCAT44(in_register_00000034,iVar2));
    if (0x20 < uVar1) break;
  } while ((0x100002600U >> ((ulong)uVar1 & 0x3f) & 1) != 0);
  this->consumed_ = false;
  iVar2 = getc(this,(FILE *)CONCAT44(in_register_00000034,iVar2));
  if (iVar2 != expected) {
    this->consumed_ = false;
  }
  return iVar2 == expected;
}

Assistant:

bool expect(const int expected) {
    skip_ws();
    if (getc() != expected) {
      ungetc();
      return false;
    }
    return true;
  }